

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

void printstack(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint idx;
  
  iVar2 = lua_gettop(L);
  if (0 < iVar2) {
    idx = 1;
    do {
      pcVar3 = luaL_tolstring(L,idx,(size_t *)0x0);
      printf("%3d: %s\n",(ulong)idx,pcVar3);
      lua_settop(L,-2);
      iVar1 = (1 - iVar2) + idx;
      idx = idx + 1;
    } while (iVar1 != 1);
  }
  putchar(10);
  return;
}

Assistant:

static void printstack (lua_State *L) {
  int i;
  int n = lua_gettop(L);
  for (i = 1; i <= n; i++) {
    printf("%3d: %s\n", i, luaL_tolstring(L, i, NULL));
    lua_pop(L, 1);
  }
  printf("\n");
}